

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

ExpEmit __thiscall FxUnaryNotBoolean::Emit(FxUnaryNotBoolean *this,VMFunctionBuilder *build)

{
  PType *pPVar1;
  uint uVar2;
  int opc;
  uint opa;
  
  pPVar1 = this->Operand->ValueType;
  if (pPVar1 != (this->super_FxExpression).ValueType) {
    __assert_fail("Operand->ValueType == ValueType",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x3b1,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
  }
  if (pPVar1 == (PType *)TypeBool) {
    uVar2 = (*this->Operand->_vptr_FxExpression[7])();
    if ((uVar2 >> 0x10 & 1) == 0) {
      opa = uVar2 & 0xff;
      VMFunctionBuilder::Emit(build,0x6d,opa,opa,0);
      opc = VMFunctionBuilder::GetConstantInt(build,1);
      VMFunctionBuilder::Emit(build,0x62,opa,opa,opc);
      return SUB43(uVar2,0);
    }
    __assert_fail("!from.Konst",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x3b4,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
  }
  __assert_fail("ValueType == TypeBool",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x3b2,"virtual ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxUnaryNotBoolean::Emit(VMFunctionBuilder *build)
{
	assert(Operand->ValueType == ValueType);
	assert(ValueType == TypeBool);
	ExpEmit from = Operand->Emit(build);
	assert(!from.Konst);
	// ~x & 1
	build->Emit(OP_NOT, from.RegNum, from.RegNum, 0);
	build->Emit(OP_AND_RK, from.RegNum, from.RegNum, build->GetConstantInt(1));
	return from;
}